

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

void Abc_ExactTestSingleOutput(int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pNtk1;
  Abc_Ntk_t *pAVar2;
  int pArrTimeProfile [4];
  word pTruth [4];
  
  pTruth[2] = 0;
  pTruth[3] = 0;
  pTruth[0] = 0xcafe;
  pTruth[1] = 0;
  pArrTimeProfile[0] = 6;
  pArrTimeProfile[1] = 2;
  pArrTimeProfile[2] = 8;
  pArrTimeProfile[3] = 5;
  pNtk1 = Abc_NtkFromTruthTable(pTruth,4);
  pAVar2 = Abc_NtkFindExact(pTruth,4,1,-1,(int *)0x0,0,0,fVerbose);
  Abc_NtkShortNames(pAVar2);
  Abc_NtkCecSat(pNtk1,pAVar2,10000,0);
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    __assert_fail("pNtk2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x9da,"void Abc_ExactTestSingleOutput(int)");
  }
  if (pAVar2->nObjCounts[7] != 6) {
    __assert_fail("Abc_NtkNodeNum( pNtk2 ) == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x9db,"void Abc_ExactTestSingleOutput(int)");
  }
  Abc_NtkDelete(pAVar2);
  pAVar2 = Abc_NtkFindExact(pTruth,4,1,3,(int *)0x0,0,0,fVerbose);
  Abc_NtkShortNames(pAVar2);
  Abc_NtkCecSat(pNtk1,pAVar2,10000,0);
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    __assert_fail("pNtk3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x9e1,"void Abc_ExactTestSingleOutput(int)");
  }
  iVar1 = Abc_NtkLevel(pAVar2);
  if (3 < iVar1) {
    __assert_fail("Abc_NtkLevel( pNtk3 ) <= 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x9e2,"void Abc_ExactTestSingleOutput(int)");
  }
  Abc_NtkDelete(pAVar2);
  pAVar2 = Abc_NtkFindExact(pTruth,4,1,9,pArrTimeProfile,50000,0,fVerbose);
  Abc_NtkShortNames(pAVar2);
  Abc_NtkCecSat(pNtk1,pAVar2,10000,0);
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    __assert_fail("pNtk4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x9e8,"void Abc_ExactTestSingleOutput(int)");
  }
  iVar1 = Abc_NtkLevel(pAVar2);
  if (9 < iVar1) {
    __assert_fail("Abc_NtkLevel( pNtk4 ) <= 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x9e9,"void Abc_ExactTestSingleOutput(int)");
  }
  Abc_NtkDelete(pAVar2);
  pAVar2 = Abc_NtkFindExact(pTruth,4,1,2,(int *)0x0,50000,0,fVerbose);
  if (pAVar2 != (Abc_Ntk_t *)0x0) {
    __assert_fail("!Abc_NtkFindExact( pTruth, 4, 1, 2, NULL, 50000, 0, fVerbose )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0x9ec,"void Abc_ExactTestSingleOutput(int)");
  }
  pAVar2 = Abc_NtkFindExact(pTruth,4,1,8,pArrTimeProfile,50000,0,fVerbose);
  if (pAVar2 == (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(pNtk1);
    return;
  }
  __assert_fail("!Abc_NtkFindExact( pTruth, 4, 1, 8, pArrTimeProfile, 50000, 0, fVerbose )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                ,0x9ee,"void Abc_ExactTestSingleOutput(int)");
}

Assistant:

void Abc_ExactTestSingleOutput( int fVerbose )
{
    extern void Abc_NtkCecSat( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nConfLimit, int nInsLimit );

    word pTruth[4] = {0xcafe, 0, 0, 0};
    Abc_Ntk_t * pNtk, * pNtk2, * pNtk3, * pNtk4;
    int pArrTimeProfile[4] = {6, 2, 8, 5};

    pNtk = Abc_NtkFromTruthTable( pTruth, 4 );

    pNtk2 = Abc_NtkFindExact( pTruth, 4, 1, -1, NULL, 0, 0, fVerbose );
    Abc_NtkShortNames( pNtk2 );
    Abc_NtkCecSat( pNtk, pNtk2, 10000, 0 );
    assert( pNtk2 );
    assert( Abc_NtkNodeNum( pNtk2 ) == 6 );
    Abc_NtkDelete( pNtk2 );

    pNtk3 = Abc_NtkFindExact( pTruth, 4, 1, 3, NULL, 0, 0, fVerbose );
    Abc_NtkShortNames( pNtk3 );
    Abc_NtkCecSat( pNtk, pNtk3, 10000, 0 );
    assert( pNtk3 );
    assert( Abc_NtkLevel( pNtk3 ) <= 3 );
    Abc_NtkDelete( pNtk3 );

    pNtk4 = Abc_NtkFindExact( pTruth, 4, 1, 9, pArrTimeProfile, 50000, 0, fVerbose );
    Abc_NtkShortNames( pNtk4 );
    Abc_NtkCecSat( pNtk, pNtk4, 10000, 0 );
    assert( pNtk4 );
    assert( Abc_NtkLevel( pNtk4 ) <= 9 );
    Abc_NtkDelete( pNtk4 );

    assert( !Abc_NtkFindExact( pTruth, 4, 1, 2, NULL, 50000, 0, fVerbose ) );

    assert( !Abc_NtkFindExact( pTruth, 4, 1, 8, pArrTimeProfile, 50000, 0, fVerbose ) );

    Abc_NtkDelete( pNtk );
}